

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O2

value_type * __thiscall
FadBinaryMinus<FadCst<double>,_Fad<Fad<double>_>_>::fastAccessDx
          (value_type *__return_storage_ptr__,
          FadBinaryMinus<FadCst<double>,_Fad<Fad<double>_>_> *this,int i)

{
  FadExpr<FadUnaryMin<Fad<double>_>_> local_10;
  
  local_10.fadexpr_.expr_ = (FadUnaryMin<Fad<double>_>)((this->right_->dx_).ptr_to_data + i);
  Fad<double>::Fad<FadUnaryMin<Fad<double>>>(__return_storage_ptr__,&local_10);
  return __return_storage_ptr__;
}

Assistant:

value_type fastAccessDx(int i) const { return - right_.fastAccessDx(i);}